

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidylib.c
# Opt level: O3

int tidySetCharEncoding(TidyDoc tdoc,ctmbstr encnam)

{
  int encoding;
  Bool BVar1;
  TidyDocImpl *impl;
  
  if (tdoc != (TidyDoc)0x0) {
    encoding = prvTidyCharEncodingId((TidyDocImpl *)tdoc,encnam);
    if ((-1 < encoding) &&
       (BVar1 = prvTidyAdjustCharEncoding((TidyDocImpl *)tdoc,encoding), BVar1 != no)) {
      return 0;
    }
    prvTidyReportBadArgument((TidyDocImpl *)tdoc,"char-encoding");
  }
  return -0x16;
}

Assistant:

int TIDY_CALL         tidySetCharEncoding( TidyDoc tdoc, ctmbstr encnam )
{
    TidyDocImpl* impl = tidyDocToImpl( tdoc );
    if ( impl )
    {
        int enc = TY_(CharEncodingId)( impl, encnam );
        if ( enc >= 0 && TY_(AdjustCharEncoding)(impl, enc) )
            return 0;

        TY_(ReportBadArgument)( impl, "char-encoding" );
    }
    return -EINVAL;
}